

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

void __thiscall
RTree<int,_double,_2,_double,_8,_4>::InitParVars
          (RTree<int,_double,_2,_double,_8,_4> *this,PartitionVars *a_parVars,int a_maxRects,
          int a_minFill)

{
  undefined4 in_ECX;
  int in_EDX;
  long in_RSI;
  int index;
  int local_1c;
  
  if (in_RSI != 0) {
    *(undefined4 *)(in_RSI + 0x30) = 0;
    *(undefined4 *)(in_RSI + 0x2c) = 0;
    *(undefined8 *)(in_RSI + 0x80) = 0;
    *(undefined8 *)(in_RSI + 0x78) = 0;
    *(int *)(in_RSI + 0x24) = in_EDX;
    *(undefined4 *)(in_RSI + 0x28) = in_ECX;
    for (local_1c = 0; local_1c < in_EDX; local_1c = local_1c + 1) {
      *(undefined4 *)(in_RSI + (long)local_1c * 4) = 0xffffffff;
    }
    return;
  }
  __assert_fail("a_parVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                ,0x573,
                "void RTree<int, double, 2>::InitParVars(PartitionVars *, int, int) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
               );
}

Assistant:

RTREE_TEMPLATE
void RTREE_QUAL::InitParVars(PartitionVars* a_parVars, int a_maxRects, int a_minFill)
{
  ASSERT(a_parVars);

  a_parVars->m_count[0] = a_parVars->m_count[1] = 0;
  a_parVars->m_area[0] = a_parVars->m_area[1] = (ELEMTYPEREAL)0;
  a_parVars->m_total = a_maxRects;
  a_parVars->m_minFill = a_minFill;
  for(int index=0; index < a_maxRects; ++index)
  {
    a_parVars->m_partition[index] = PartitionVars::NOT_TAKEN;
  }
}